

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::PreprocessorCaseGroup::PreprocessorCase::iterate(PreprocessorCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  TestLog *pTVar3;
  ContextInfo *pCVar4;
  RenderContext *pRVar5;
  glUniform1iFunc p_Var6;
  glUniform4fFunc p_Var7;
  int iVar8;
  GLenum GVar9;
  GLint GVar10;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  char *__s;
  mapped_type *pmVar13;
  long *plVar14;
  TestError *this_00;
  size_type *psVar15;
  GLSLVersion extraout_EDX;
  GLSLVersion extraout_EDX_00;
  GLSLVersion glslVersion;
  char *pcVar16;
  undefined1 auVar17 [8];
  undefined1 auVar18 [8];
  long lVar19;
  Surface resultSurface;
  string frgSrc;
  ShaderProgram p;
  ProgramSources sources;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  FBOSentry fbo;
  allocator<char> local_2b2;
  allocator<char> local_2b1;
  string local_2b0;
  undefined1 local_290 [8];
  void *local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  undefined4 local_268;
  TestLog *local_260;
  value_type local_258;
  string local_238;
  undefined1 local_218 [152];
  GLuint local_180;
  bool local_158;
  undefined1 local_148 [8];
  _Alloc_hider local_140;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  pointer pbStack_110;
  int local_108;
  undefined1 *local_100;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_b8;
  undefined1 local_98 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  FBOSentry local_48;
  Functions *pFVar11;
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar11 = (Functions *)CONCAT44(extraout_var,iVar8);
  pCVar4 = ((this->super_TestCase).m_context)->m_contextInfo;
  local_218._0_8_ = "GL_KHR_blend_equation_advanced";
  _Var12 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                     ((pCVar4->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (pCVar4->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var12._M_current ==
      (pCVar4->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
    return STOP;
  }
  local_48.m_gl = pFVar11;
  FBOSentry::init(&local_48,(EVP_PKEY_CTX *)&DAT_00000004);
  (*pFVar11->clearColor)(0.125,0.125,0.125,1.0);
  (*pFVar11->clear)(0x4000);
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  pcVar2 = local_218 + 0x10;
  local_218._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"VERSION_DIRECTIVE","");
  local_260 = pTVar3;
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_78,(key_type *)local_218);
  pcVar16 = (char *)pmVar13->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar16,(ulong)__s);
  if ((pointer)local_218._0_8_ != pcVar2) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  if (this->m_behaviour == (char *)0x0) {
    local_218._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"EXTENSION_DIRECTIVE","");
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_78,(key_type *)local_218);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x1aee929);
    auVar17 = (undefined1  [8])local_218._16_8_;
    auVar18 = (undefined1  [8])local_218._0_8_;
    if ((pointer)local_218._0_8_ == pcVar2) goto LAB_00d7cda6;
  }
  else {
    local_148 = (undefined1  [8])local_138;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"#extension GL_KHR_blend_equation_advanced : ","");
    plVar14 = (long *)std::__cxx11::string::append(local_148);
    psVar15 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar15) {
      local_218._16_8_ = *psVar15;
      local_218._24_4_ = (undefined4)plVar14[3];
      local_218._28_4_ = *(undefined4 *)((long)plVar14 + 0x1c);
      local_218._0_8_ = pcVar2;
    }
    else {
      local_218._16_8_ = *psVar15;
      local_218._0_8_ = (size_type *)*plVar14;
    }
    local_218._8_8_ = plVar14[1];
    *plVar14 = (long)psVar15;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_290 = (undefined1  [8])&local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"EXTENSION_DIRECTIVE","");
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_78,(key_type *)local_290);
    std::__cxx11::string::operator=((string *)pmVar13,(string *)local_218);
    if (local_290 != (undefined1  [8])&local_280) {
      operator_delete((void *)local_290,local_280._M_allocated_capacity + 1);
    }
    if ((pointer)local_218._0_8_ != pcVar2) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    auVar17 = local_138;
    auVar18 = local_148;
    if (local_148 == (undefined1  [8])local_138) goto LAB_00d7cda6;
  }
  operator_delete((void *)auVar18,(long)auVar17 + 1);
LAB_00d7cda6:
  local_148 = (undefined1  [8])local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_148,
             "${VERSION_DIRECTIVE}\n${EXTENSION_DIRECTIVE}\nprecision highp float;\n\nuniform vec4 uDefined;\nuniform vec4 uNonDefined;\n\nuniform int  uValue;\n\nlayout(location = 0) out vec4 oCol;\n\nvoid main (void) {\n    vec4 col = uNonDefined;\n#if defined(GL_KHR_blend_equation_advanced)\n    int val = GL_KHR_blend_equation_advanced;\n    if (uValue == val) {\n        col = uDefined;\n    }\n#endif\n    oCol = col;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_218,(string *)local_148);
  tcu::StringTemplate::specialize
            (&local_238,(StringTemplate *)local_218,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_78);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_218);
  glslVersion = extraout_EDX;
  if (local_148 != (undefined1  [8])local_138) {
    operator_delete((void *)local_148,(long)local_138 + 1);
    glslVersion = extraout_EDX_00;
  }
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  GetDef2DVtxSrc_abi_cxx11_(&local_2b0,(glcts *)(ulong)this->m_glslVersion,glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_290,local_2b0._M_dataplus._M_p,&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,local_238._M_dataplus._M_p,&local_2b2);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_148,0,0xac);
  local_98._0_8_ = (pointer)0x0;
  local_98[8] = 0;
  local_98._9_7_ = 0;
  local_98[0x10] = 0;
  local_98._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148,(value_type *)local_290);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_130,&local_258);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_218,pRVar5,(ProgramSources *)local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_b8);
  lVar19 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_148 + lVar19));
    lVar19 = lVar19 + -0x18;
  } while (lVar19 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_290 != (undefined1  [8])&local_280) {
    operator_delete((void *)local_290,local_280._M_allocated_capacity + 1);
  }
  paVar1 = &local_2b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != false) {
    (*pFVar11->useProgram)(local_180);
    GVar9 = (*pFVar11->getError)();
    glu::checkError(GVar9,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6b9);
    p_Var6 = pFVar11->uniform1i;
    GVar10 = (*pFVar11->getUniformLocation)(local_180,"uValue");
    (*p_Var6)(GVar10,1);
    p_Var7 = pFVar11->uniform4f;
    GVar10 = (*pFVar11->getUniformLocation)(local_180,"uDefined");
    (*p_Var7)(GVar10,0.0,1.0,0.0,1.0);
    p_Var7 = pFVar11->uniform4f;
    GVar10 = (*pFVar11->getUniformLocation)(local_180,"uNonDefined");
    (*p_Var7)(GVar10,1.0,0.0,1.0,1.0);
    GVar9 = (*pFVar11->getError)();
    glu::checkError(GVar9,"Uniforms failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6be);
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"aPos","");
    local_290._0_4_ = A;
    local_288 = (void *)((long)&local_280 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,local_2b0._M_dataplus._M_p,
               local_2b0._M_string_length + local_2b0._M_dataplus._M_p);
    local_268 = 0;
    local_148._0_4_ = local_290._0_4_;
    local_140._M_p = (pointer)&local_130;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_288,local_280._M_allocated_capacity + (long)local_288);
    local_130.field_2._M_allocated_capacity._0_4_ = local_268;
    local_130.field_2._8_8_ = 8;
    pbStack_110 = (pointer)0x400000002;
    local_108 = 0;
    local_100 = s_pos;
    if (local_288 != (void *)((long)&local_280 + 8)) {
      operator_delete(local_288,local_280._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    local_290._0_4_ = R;
    local_290._4_4_ = UNORM_INT32;
    local_288 = (void *)CONCAT44(local_288._4_4_,1);
    local_280._M_allocated_capacity = (size_type)s_indices;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_180,1,
              (VertexArrayBinding *)local_148,(PrimitiveList *)local_290,(DrawUtilCallback *)0x0);
    GVar9 = (*pFVar11->getError)();
    glu::checkError(GVar9,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6c3);
    tcu::Surface::Surface((Surface *)&local_2b0,4,4);
    pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_258._M_dataplus._M_p = (pointer)0x300000008;
    if ((int *)local_2b0.field_2._M_allocated_capacity != (int *)0x0) {
      local_2b0.field_2._M_allocated_capacity = local_2b0._M_string_length;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_290,(TextureFormat *)&local_258,
               (int)local_2b0._M_dataplus._M_p,local_2b0._M_dataplus._M_p._4_4_,1,
               (void *)local_2b0.field_2._M_allocated_capacity);
    glu::readPixels(pRVar5,0,0,(PixelBufferAccess *)local_290);
    GVar9 = (*pFVar11->getError)();
    glu::checkError(GVar9,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6c8);
    pcVar16 = "Pass";
    if (*(int *)local_2b0._M_string_length != -0xff0100) {
      pcVar16 = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(*(int *)local_2b0._M_string_length != -0xff0100),pcVar16);
    tcu::Surface::~Surface((Surface *)&local_2b0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._M_p !=
        &local_130) {
      operator_delete(local_140._M_p,(long)local_130._M_dataplus._M_p + 1);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_78);
    FBOSentry::~FBOSentry(&local_48);
    return STOP;
  }
  glu::operator<<(local_260,(ShaderProgram *)local_218);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
             ,0x6b6);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

PreprocessorCaseGroup::PreprocessorCase::IterateResult PreprocessorCaseGroup::PreprocessorCase::iterate(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
	const int			  dim = 4;

	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	FBOSentry fbo(gl, dim, dim, GL_RGBA8);
	gl.clearColor(0.125f, 0.125f, 0.125f, 1.f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Test that GL_KHR_blend_equation_advanced is defined and it has value 1.
	// Renders green pixels if above is true, red pixels otherwise.
	static const char* frgSrcTemplate = "${VERSION_DIRECTIVE}\n"
										"${EXTENSION_DIRECTIVE}\n"
										"precision highp float;\n"
										"\n"
										"uniform vec4 uDefined;\n"
										"uniform vec4 uNonDefined;\n"
										"\n"
										"uniform int  uValue;\n"
										"\n"
										"layout(location = 0) out vec4 oCol;\n"
										"\n"
										"void main (void) {\n"
										"    vec4 col = uNonDefined;\n"
										"#if defined(GL_KHR_blend_equation_advanced)\n"
										"    int val = GL_KHR_blend_equation_advanced;\n"
										"    if (uValue == val) {\n"
										"        col = uDefined;\n"
										"    }\n"
										"#endif\n"
										"    oCol = col;\n"
										"}\n";

	std::map<std::string, std::string> args;
	args["VERSION_DIRECTIVE"] = glu::getGLSLVersionDeclaration(m_glslVersion);
	if (m_behaviour)
		args["EXTENSION_DIRECTIVE"] = std::string("#extension GL_KHR_blend_equation_advanced : ") + m_behaviour;
	else
		args["EXTENSION_DIRECTIVE"] = "";
	std::string frgSrc				= tcu::StringTemplate(frgSrcTemplate).specialize(args);

	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}
	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	gl.uniform1i(gl.getUniformLocation(p.getProgram(), "uValue"), 1);
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uDefined"), 0.f, 1.f, 0.f, 1.f);
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uNonDefined"), 1.f, 0.f, 1.f, 1.f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);
	glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

	// Check the results.
	tcu::Surface resultSurface(dim, dim);
	glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");
	bool pass = tcu::RGBA::green() == resultSurface.getPixel(0, 0);

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");

	return STOP;
}